

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O1

void __thiscall ast::Dir_byte::~Dir_byte(Dir_byte *this)

{
  _List_node_base *p_Var1;
  list<ast::Expression_*,_std::allocator<ast::Expression_*>_> *plVar2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_byte_0013c870;
  p_Var1 = (_List_node_base *)this->value_list;
  for (p_Var4 = (((_List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_> *)
                 &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next; p_Var4 != p_Var1
      ; p_Var4 = (((_List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_> *)
                  &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 8))();
    }
  }
  plVar2 = this->value_list;
  if (plVar2 != (list<ast::Expression_*,_std::allocator<ast::Expression_*>_> *)0x0) {
    p_Var1 = (plVar2->super__List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var1 != (_List_node_base *)plVar2) {
      p_Var4 = (((_List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_> *)
                &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var1);
      p_Var1 = p_Var4;
    }
    operator_delete(plVar2);
  }
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Statement_0013bf38;
  pcVar3 = (this->super_Directive).super_Statement.label._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == &(this->super_Directive).super_Statement.label.field_2) {
    return;
  }
  operator_delete(pcVar3);
  return;
}

Assistant:

Dir_byte::~Dir_byte()
{
	for (auto s: *value_list)
		delete s;
	delete value_list;
}